

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QAbstractItemView::clearSelection(QAbstractItemView *this)

{
  bool bVar1;
  
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)(*(long *)(this + 8) + 800));
  if (bVar1) {
    QItemSelectionModel::clearSelection();
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }